

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

int HorseTrap(Situation *s)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int *in_RDI;
  int pos;
  int i;
  int r;
  int dst;
  int *horse_leg;
  int *horse_dst;
  int horse_traps_value [2];
  int moveble;
  int side_tag;
  int local_34;
  int local_30;
  int local_2c;
  int *local_28;
  int *local_20;
  int local_18 [5];
  
  for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
    local_18[3] = local_30 * 0x10 + 0x10;
    local_18[local_30] = 0;
    for (local_34 = 5; local_34 < 7; local_34 = local_34 + 1) {
      uVar2 = (uint)*(byte *)((long)in_RDI + (long)(local_18[3] + local_34) + 0x104);
      if (uVar2 != 0) {
        local_18[2] = 0;
        local_20 = HORSE_CAN_GET[(int)uVar2];
        local_28 = HORSE_LEG[(int)uVar2];
        local_2c = *local_20;
        while ((local_2c != 0 &&
               (((((EDGE_SQUARES[local_2c] & 1U) != 0 ||
                  (*(char *)((long)in_RDI + (long)local_2c + 4) != '\0')) ||
                 (*(char *)((long)in_RDI + (long)*local_28 + 4) != '\0')) ||
                ((bVar1 = IfProtected((int)horse_leg,dst,_pos,(int)((ulong)in_RDI >> 0x20)), bVar1
                 || (local_18[2] = local_18[2] + 1, local_18[2] < 2))))))) {
          local_20 = local_20 + 1;
          local_2c = *local_20;
          local_28 = local_28 + 1;
        }
        if (local_18[2] == 0) {
          local_18[local_30] = local_18[local_30] + 10;
        }
        else if (local_18[2] == 1) {
          local_18[local_30] = local_18[local_30] + 5;
        }
      }
    }
  }
  iVar3 = SideValue(*in_RDI,local_18[1] - local_18[0]);
  return iVar3;
}

Assistant:

int HorseTrap(Situation &s)
{
    int side_tag;
    int moveble;
    int horse_traps_value[2];
    int *horse_dst, *horse_leg;
    int dst;
    for (int r = 0; r < 2; r++)
    {
        side_tag = 16 + (r << 4);
        horse_traps_value[r] = 0;
        // 考虑马可以走的位置，走到棋盘边缘上，或者走到对方的控制格，都必须排除
        for (int i = 5; i <= 6; i++)
        {
            int pos = s.current_pieces[side_tag + i];
            if (pos != 0)
            {
                moveble = 0;
                horse_dst = HORSE_CAN_GET[pos];
                horse_leg = HORSE_LEG[pos];
                dst = *horse_dst;
                while (dst)
                {
                    if (!EDGE_SQUARES[dst] && !s.current_board[dst] && !s.current_board[*horse_leg] && !IfProtected(1 - r, dst, s))
                    {
                        moveble++;
                        if (moveble > 1)
                            break;
                    }
                    horse_dst++;
                    dst = *horse_dst;
                    horse_leg++;
                }
                // 没有好的着法的马给予10分罚分，只有一个好的着法的马给予5分罚分
                if (!moveble)
                    horse_traps_value[r] += 10;
                else if (moveble == 1)
                    horse_traps_value[r] += 5;
            }
        }
    }
    return SideValue(s.current_player, horse_traps_value[1] - horse_traps_value[0]);
}